

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O2

void interpolate_extremum
               (int row,int col,response_layer *top,response_layer *middle,response_layer *bottom,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 in_register_00001304 [12];
  float offsets [3];
  ulong local_158;
  uint local_150;
  undefined1 local_148 [76];
  undefined1 local_fc [64];
  undefined1 local_bc [64];
  undefined1 local_7c [64];
  float local_3c [3];
  
  iVar1 = bottom->filter_size;
  iVar2 = middle->filter_size;
  interpolate_step(row,col,top,middle,bottom,(float *)&local_158);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_158;
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar5,auVar8);
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  uVar3 = vcmpps_avx512vl(auVar5,auVar4,1);
  if (((uVar3 & 1) != 0) && ((uVar3 >> 1 & 1) != 0)) {
    auVar5 = vandps_avx(ZEXT416(local_150),auVar8);
    if (auVar5._0_4_ < 0.5) {
      local_fc = ZEXT864(0) << 0x20;
      local_3c[0] = 0.0;
      local_3c[1] = 0.0;
      fVar10 = (float)top->step;
      auVar5 = vpinsrd_avx(ZEXT416((uint)col),row,1);
      auVar5 = vcvtdq2ps_avx(auVar5);
      auVar6._0_4_ = ((float)local_158 + auVar5._0_4_) * fVar10;
      auVar6._4_4_ = ((float)(local_158 >> 0x20) + auVar5._4_4_) * fVar10;
      auVar6._8_4_ = (auVar5._8_4_ + 0.0) * fVar10;
      auVar6._12_4_ = (auVar5._12_4_ + 0.0) * fVar10;
      local_148._0_8_ = vmovlps_avx(auVar6);
      auVar7._0_4_ = (float)(iVar2 - iVar1);
      auVar7._4_12_ = in_register_00001304;
      auVar9._0_4_ = (float)middle->filter_size;
      auVar9._4_12_ = in_register_00001304;
      auVar5 = vfmadd213ss_fma(auVar7,ZEXT416(local_150),auVar9);
      local_148._8_4_ = auVar5._0_4_ * 0.1333;
      local_148._18_58_ = SUB6458(ZEXT864(0),2);
      local_148[0x11] =
           middle->laplacian[(middle->width * row + col) * (middle->width / top->width)];
      local_148._12_5_ = 0x100000000;
      local_bc = local_fc;
      local_7c = local_fc;
      std::vector<interest_point,_std::allocator<interest_point>_>::push_back
                (interest_points,(value_type *)local_148);
    }
  }
  return;
}

Assistant:

void interpolate_extremum(int row, int col,
                          struct response_layer *top, struct response_layer *middle, struct response_layer *bottom,
                          std::vector<struct interest_point> *interest_points) {

    assert(top != NULL && middle != NULL && bottom != NULL);
    assert(interest_points != NULL);

    // getting step distance between filters
    int filter_step = (middle->filter_size - bottom->filter_size);

    // checking if middle filter is mid way between top and bottom
    assert(filter_step > 0 && top->filter_size - middle->filter_size == middle->filter_size - bottom->filter_size);

    // getting sub-pixel offset of extremum to actual location
    float offsets[3];
    interpolate_step(row, col, top, middle, bottom, offsets);

    // getting sub-pixel offsets and assigning them to variables for clarity
    float dx = offsets[0];
    float dy = offsets[1];
    float ds = offsets[2];

    // checking if sub-pixel offsets are less than 0.5 and
    // would thus rounded sub-pixel location is the same as pixel location
    if (fabs(dx) < 0.5f && fabs(dy) < 0.5f && fabs(ds) < 0.5f) {

        // initializing interest point
        struct interest_point ip = {
            .x = (float) ((col + dx) * top->step),
            .y = (float) ((row + dy) * top->step),
            .scale = (float) ((0.1333f) * (middle->filter_size + ds * filter_step)),
            .orientation = 0.0f,
            .upright = true,
            .laplacian = get_laplacian_relative(middle, row, col, top),
            .descriptor = {0}
        };

        // Add interest point to vector
        interest_points->push_back(ip);

    }

}